

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void update_index(storage_t *st,bool checkpointing)

{
  idx_prams_t *start_key;
  checkpoint_t *pcVar1;
  fdb_status fVar2;
  int iVar3;
  undefined7 in_register_00000031;
  person_t *p_00;
  uint local_174;
  fdb_doc *rdoc;
  person_t *p;
  fdb_iterator *it;
  int local_154;
  size_t vallen;
  timeval __test_begin;
  char rbuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  p = (person_t *)0x0;
  rdoc = (fdb_doc *)0x0;
  start_key = st->index_params;
  reset_storage_index(st);
  local_154 = (int)CONCAT71(in_register_00000031,checkpointing);
  if (local_154 != 0) {
    start_checkpoint(st);
  }
  fVar2 = fdb_iterator_init(st->index1,&it,start_key,0xc,start_key->max,0xc,2);
  if ((fVar2 != FDB_RESULT_ITERATOR_FAIL) && (fVar2 != FDB_RESULT_SUCCESS)) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
            ,0x77);
    __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                  ,0x77,"void update_index(storage_t *, bool)");
  }
  local_174 = 0;
  do {
    fVar2 = fdb_iterator_get(it,&rdoc);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_kv(st->all_docs,rdoc->body,rdoc->bodylen,&p,&vallen);
      p_00 = p;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        iVar3 = strcmp(p->keyspace,st->keyspace);
        if (iVar3 == 0) {
          e2e_fdb_del_person(st,p_00);
          local_174 = local_174 + 1;
          p_00 = p;
        }
        free(p_00);
        p = (person_t *)0x0;
      }
      fdb_doc_free(rdoc);
      rdoc = (fdb_doc *)0x0;
    }
    fVar2 = fdb_iterator_next(it);
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  if ((char)local_154 != '\0') {
    end_checkpoint(st);
  }
  fdb_iterator_close(it);
  pcVar1 = st->v_chk;
  pcVar1->num_indexed = 0;
  pcVar1->sum_age_indexed = 0;
  sprintf(rbuf,"update index: %03d docs deleted",(ulong)local_174);
  return;
}

Assistant:

void update_index(storage_t *st, bool checkpointing) {

    TEST_INIT();

    fdb_iterator *it;
    person_t *p = NULL;
    fdb_doc *rdoc = NULL;
    fdb_status status;
    int n = 0;
    size_t vallen;
    char *mink = st->index_params->min;
    char *maxk = st->index_params->max;
    char rbuf[256];

    // change storage index range
    reset_storage_index(st);

    if (checkpointing) {
        start_checkpoint(st);
    }
    status = fdb_iterator_init(st->index1, &it, mink, 12,
                               maxk, 12, FDB_ITR_NO_DELETES);
    if (status != FDB_RESULT_SUCCESS) {
        // no items within min max range
        TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);
    }



    do {
        status = fdb_iterator_get(it, &rdoc);
        if (status == FDB_RESULT_SUCCESS) {
            status = fdb_get_kv(st->all_docs,
                                rdoc->body, rdoc->bodylen,
                                (void **)&p, &vallen);
            if (status == FDB_RESULT_SUCCESS) {
                if (strcmp(p->keyspace, st->keyspace) == 0) {
                    e2e_fdb_del_person(st, p);
                    n++;
                }
                free(p);
                p=NULL;
            }
            fdb_doc_free(rdoc);
            rdoc=NULL;
        }
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);

    if (checkpointing) {
        end_checkpoint(st);
    }

    fdb_iterator_close(it);

    // reset verification chkpoint
    st->v_chk->num_indexed = 0;
    st->v_chk->sum_age_indexed = 0;

    sprintf(rbuf, "update index: %03d docs deleted", n);
#ifdef __DEBUG_E2E
    TEST_RESULT(rbuf);
#endif
}